

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::GetAllTestDependencies
          (cmCTestMultiProcessHandler *this,int test,TestList *dependencies)

{
  mapped_type *pmVar1;
  _Base_ptr p_Var2;
  int i;
  _Rb_tree_color local_30;
  int local_2c;
  
  local_2c = test;
  pmVar1 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::operator[](&(this->Tests).
                         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                        ,&local_2c);
  for (p_Var2 = (pmVar1->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(pmVar1->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
       super__Rb_tree_header; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    local_30 = p_Var2[1]._M_color;
    GetAllTestDependencies(this,local_30,dependencies);
    std::vector<int,_std::allocator<int>_>::push_back
              (&dependencies->super_vector<int,_std::allocator<int>_>,
               (value_type_conflict2 *)&local_30);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::GetAllTestDependencies(int test,
                                                        TestList& dependencies)
{
  TestSet const& dependencySet = this->Tests[test];
  for (int i : dependencySet) {
    GetAllTestDependencies(i, dependencies);
    dependencies.push_back(i);
  }
}